

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiAreaPrivate::_q_closeTab(QMdiAreaPrivate *this,int index)

{
  QWidget::close((QWidget *)(this->childWindows).d.ptr[index].wp.value,index);
  return;
}

Assistant:

void QMdiAreaPrivate::_q_closeTab(int index)
{
#if !QT_CONFIG(tabbar)
    Q_UNUSED(index);
#else
    QMdiSubWindow *subWindow = childWindows.at(index);
    Q_ASSERT(subWindow);
    subWindow->close();
#endif // QT_CONFIG(tabbar)
}